

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_panel.cxx
# Opt level: O0

Fl_Double_Window * make_project_window(void)

{
  Fl_Double_Window *this;
  Fl_Button *this_00;
  Fl_Tabs *this_01;
  Fl_Group *pFVar1;
  Fl_Widget *pFVar2;
  Fl_Group *o_4;
  Fl_Box *o_3;
  Fl_Group *o_2;
  Fl_Tabs *o_1;
  Fl_Button *o;
  
  this = (Fl_Double_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window(this,399,0xfc,"Project Settings");
  project_window = this;
  this_00 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(this_00,0x148,0xd8,0x3c,0x19,"Close");
  Fl_Widget::tooltip((Fl_Widget *)this_00,"Close this dialog.");
  Fl_Widget::callback((Fl_Widget *)this_00,cb_Close);
  this_01 = (Fl_Tabs *)operator_new(200);
  Fl_Tabs::Fl_Tabs(this_01,10,10,0x17a,0xc3,(char *)0x0);
  Fl_Widget::selection_color((Fl_Widget *)this_01,0xc);
  pFVar1 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar1,10,0x24,0x17a,0xa9,"Output");
  (*(pFVar1->super_Fl_Widget)._vptr_Fl_Widget[6])();
  pFVar2 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar2,0x14,0x31,0x154,0x31,
                 "Use \"name.ext\" to set a file name or just \".ext\" to set extension.");
  Fl_Widget::align(pFVar2,0x94);
  pFVar2 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar2,0x77,0x67,0xfc,0x14,"Header File:");
  header_file_input = (Fl_Input *)pFVar2;
  Fl_Widget::tooltip(pFVar2,"The name of the generated header file.");
  Fl_Widget::box((Fl_Widget *)header_file_input,FL_THIN_DOWN_BOX);
  Fl_Widget::labelfont((Fl_Widget *)header_file_input,1);
  Fl_Input_::textfont(&header_file_input->super_Fl_Input_,4);
  Fl_Widget::callback((Fl_Widget *)header_file_input,header_input_cb,&DAT_00000001);
  Fl_Widget::when((Fl_Widget *)header_file_input,'\x01');
  pFVar2 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar2,0x77,0x80,0xfc,0x14,"Code File:");
  code_file_input = (Fl_Input *)pFVar2;
  Fl_Widget::tooltip(pFVar2,"The name of the generated code file.");
  Fl_Widget::box((Fl_Widget *)code_file_input,FL_THIN_DOWN_BOX);
  Fl_Widget::labelfont((Fl_Widget *)code_file_input,1);
  Fl_Input_::textfont(&code_file_input->super_Fl_Input_,4);
  Fl_Widget::callback((Fl_Widget *)code_file_input,code_input_cb,&DAT_00000001);
  Fl_Widget::when((Fl_Widget *)code_file_input,'\x01');
  pFVar2 = (Fl_Widget *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button
            ((Fl_Check_Button *)pFVar2,0x75,0x99,0x110,0x14,"Include Header from Code");
  include_H_from_C_button = (Fl_Check_Button *)pFVar2;
  Fl_Widget::tooltip(pFVar2,"Include the header file from the code file.");
  Fl_Button::down_box((Fl_Button *)include_H_from_C_button,FL_DOWN_BOX);
  Fl_Widget::callback((Fl_Widget *)include_H_from_C_button,include_H_from_C_button_cb);
  pFVar2 = (Fl_Widget *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button
            ((Fl_Check_Button *)pFVar2,0x75,0xb0,0x110,0x14,"Menu shortcuts use FL_COMMAND");
  use_FL_COMMAND_button = (Fl_Check_Button *)pFVar2;
  Fl_Widget::tooltip(pFVar2,"Replace FL_CTRL with FL_COMMAND when generating menu shortcut code.");
  Fl_Button::down_box((Fl_Button *)use_FL_COMMAND_button,FL_DOWN_BOX);
  Fl_Widget::callback((Fl_Widget *)use_FL_COMMAND_button,use_FL_COMMAND_button_cb);
  Fl_Group::end(pFVar1);
  pFVar1 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar1,10,0x24,0x17a,0xa9,"Internationalization");
  pFVar2 = (Fl_Widget *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar2,100,0x30,0x88,0x19,"Use:");
  i18n_type_chooser = (Fl_Choice *)pFVar2;
  Fl_Widget::tooltip(pFVar2,"Type of internationalization to use.");
  Fl_Widget::box((Fl_Widget *)i18n_type_chooser,FL_THIN_UP_BOX);
  Fl_Menu_::down_box(&i18n_type_chooser->super_Fl_Menu_,FL_BORDER_BOX);
  Fl_Widget::labelfont((Fl_Widget *)i18n_type_chooser,1);
  Fl_Widget::callback((Fl_Widget *)i18n_type_chooser,i18n_type_cb);
  Fl_Menu_::menu(&i18n_type_chooser->super_Fl_Menu_,menu_i18n_type_chooser);
  pFVar2 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar2,100,0x4e,0x110,0x14,"#include:");
  i18n_include_input = (Fl_Input *)pFVar2;
  Fl_Widget::tooltip(pFVar2,"The include file for internationalization.");
  Fl_Widget::box((Fl_Widget *)i18n_include_input,FL_THIN_DOWN_BOX);
  Fl_Widget::labelfont((Fl_Widget *)i18n_include_input,1);
  Fl_Input_::textfont(&i18n_include_input->super_Fl_Input_,4);
  Fl_Widget::callback((Fl_Widget *)i18n_include_input,i18n_text_cb);
  pFVar2 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar2,100,0x68,0x110,0x14,"File:");
  i18n_file_input = (Fl_Input *)pFVar2;
  Fl_Widget::tooltip(pFVar2,"The name of the message catalog.");
  Fl_Widget::box((Fl_Widget *)i18n_file_input,FL_THIN_DOWN_BOX);
  Fl_Widget::labelfont((Fl_Widget *)i18n_file_input,1);
  Fl_Input_::textfont(&i18n_file_input->super_Fl_Input_,4);
  Fl_Widget::callback((Fl_Widget *)i18n_file_input,i18n_text_cb);
  pFVar2 = (Fl_Widget *)operator_new(200);
  Fl_Int_Input::Fl_Int_Input((Fl_Int_Input *)pFVar2,100,0x80,0x110,0x14,"Set:");
  i18n_set_input = (Fl_Int_Input *)pFVar2;
  Fl_Widget::tooltip(pFVar2,"The message set number.");
  Fl_Widget::type((Fl_Widget *)i18n_set_input,'\x02');
  Fl_Widget::box((Fl_Widget *)i18n_set_input,FL_THIN_DOWN_BOX);
  Fl_Widget::labelfont((Fl_Widget *)i18n_set_input,1);
  Fl_Input_::textfont((Fl_Input_ *)i18n_set_input,4);
  Fl_Widget::callback((Fl_Widget *)i18n_set_input,i18n_int_cb);
  pFVar2 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar2,100,0x67,0x110,0x14,"Function:");
  i18n_function_input = (Fl_Input *)pFVar2;
  Fl_Widget::tooltip(pFVar2,"The function to call to internationalize the labels and tooltips.");
  Fl_Widget::box((Fl_Widget *)i18n_function_input,FL_THIN_DOWN_BOX);
  Fl_Widget::labelfont((Fl_Widget *)i18n_function_input,1);
  Fl_Input_::textfont(&i18n_function_input->super_Fl_Input_,4);
  Fl_Widget::callback((Fl_Widget *)i18n_function_input,i18n_text_cb);
  Fl_Group::end(pFVar1);
  Fl_Group::end((Fl_Group *)this_01);
  Fl_Window::set_modal(&project_window->super_Fl_Window);
  Fl_Group::end((Fl_Group *)project_window);
  return project_window;
}

Assistant:

Fl_Double_Window* make_project_window() {
  { project_window = new Fl_Double_Window(399, 252, "Project Settings");
    { Fl_Button* o = new Fl_Button(328, 216, 60, 25, "Close");
      o->tooltip("Close this dialog.");
      o->callback((Fl_Callback*)cb_Close);
    } // Fl_Button* o
    { Fl_Tabs* o = new Fl_Tabs(10, 10, 378, 195);
      o->selection_color((Fl_Color)12);
      { Fl_Group* o = new Fl_Group(10, 36, 378, 169, "Output");
        o->hide();
        { Fl_Box* o = new Fl_Box(20, 49, 340, 49, "Use \"name.ext\" to set a file name or just \".ext\" to set extension.");
          o->align(Fl_Align(132|FL_ALIGN_INSIDE));
        } // Fl_Box* o
        { header_file_input = new Fl_Input(119, 103, 252, 20, "Header File:");
          header_file_input->tooltip("The name of the generated header file.");
          header_file_input->box(FL_THIN_DOWN_BOX);
          header_file_input->labelfont(1);
          header_file_input->textfont(4);
          header_file_input->callback((Fl_Callback*)header_input_cb, (void*)(1));
          header_file_input->when(FL_WHEN_CHANGED);
        } // Fl_Input* header_file_input
        { code_file_input = new Fl_Input(119, 128, 252, 20, "Code File:");
          code_file_input->tooltip("The name of the generated code file.");
          code_file_input->box(FL_THIN_DOWN_BOX);
          code_file_input->labelfont(1);
          code_file_input->textfont(4);
          code_file_input->callback((Fl_Callback*)code_input_cb, (void*)(1));
          code_file_input->when(FL_WHEN_CHANGED);
        } // Fl_Input* code_file_input
        { include_H_from_C_button = new Fl_Check_Button(117, 153, 272, 20, "Include Header from Code");
          include_H_from_C_button->tooltip("Include the header file from the code file.");
          include_H_from_C_button->down_box(FL_DOWN_BOX);
          include_H_from_C_button->callback((Fl_Callback*)include_H_from_C_button_cb);
        } // Fl_Check_Button* include_H_from_C_button
        { use_FL_COMMAND_button = new Fl_Check_Button(117, 176, 272, 20, "Menu shortcuts use FL_COMMAND");
          use_FL_COMMAND_button->tooltip("Replace FL_CTRL with FL_COMMAND when generating menu shortcut code.");
          use_FL_COMMAND_button->down_box(FL_DOWN_BOX);
          use_FL_COMMAND_button->callback((Fl_Callback*)use_FL_COMMAND_button_cb);
        } // Fl_Check_Button* use_FL_COMMAND_button
        o->end();
      } // Fl_Group* o
      { Fl_Group* o = new Fl_Group(10, 36, 378, 169, "Internationalization");
        { i18n_type_chooser = new Fl_Choice(100, 48, 136, 25, "Use:");
          i18n_type_chooser->tooltip("Type of internationalization to use.");
          i18n_type_chooser->box(FL_THIN_UP_BOX);
          i18n_type_chooser->down_box(FL_BORDER_BOX);
          i18n_type_chooser->labelfont(1);
          i18n_type_chooser->callback((Fl_Callback*)i18n_type_cb);
          i18n_type_chooser->menu(menu_i18n_type_chooser);
        } // Fl_Choice* i18n_type_chooser
        { i18n_include_input = new Fl_Input(100, 78, 272, 20, "#include:");
          i18n_include_input->tooltip("The include file for internationalization.");
          i18n_include_input->box(FL_THIN_DOWN_BOX);
          i18n_include_input->labelfont(1);
          i18n_include_input->textfont(4);
          i18n_include_input->callback((Fl_Callback*)i18n_text_cb);
        } // Fl_Input* i18n_include_input
        { i18n_file_input = new Fl_Input(100, 104, 272, 20, "File:");
          i18n_file_input->tooltip("The name of the message catalog.");
          i18n_file_input->box(FL_THIN_DOWN_BOX);
          i18n_file_input->labelfont(1);
          i18n_file_input->textfont(4);
          i18n_file_input->callback((Fl_Callback*)i18n_text_cb);
        } // Fl_Input* i18n_file_input
        { i18n_set_input = new Fl_Int_Input(100, 128, 272, 20, "Set:");
          i18n_set_input->tooltip("The message set number.");
          i18n_set_input->type(2);
          i18n_set_input->box(FL_THIN_DOWN_BOX);
          i18n_set_input->labelfont(1);
          i18n_set_input->textfont(4);
          i18n_set_input->callback((Fl_Callback*)i18n_int_cb);
        } // Fl_Int_Input* i18n_set_input
        { i18n_function_input = new Fl_Input(100, 103, 272, 20, "Function:");
          i18n_function_input->tooltip("The function to call to internationalize the labels and tooltips.");
          i18n_function_input->box(FL_THIN_DOWN_BOX);
          i18n_function_input->labelfont(1);
          i18n_function_input->textfont(4);
          i18n_function_input->callback((Fl_Callback*)i18n_text_cb);
        } // Fl_Input* i18n_function_input
        o->end();
      } // Fl_Group* o
      o->end();
    } // Fl_Tabs* o
    project_window->set_modal();
    project_window->end();
  } // Fl_Double_Window* project_window
  return project_window;
}